

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator __thiscall
fmt::v6::internal::float_writer<char>::prettify<fmt::v6::internal::counting_iterator>
          (float_writer<char> *this,counting_iterator it)

{
  counting_iterator it_00;
  counting_iterator it_01;
  counting_iterator it_02;
  counting_iterator it_03;
  counting_iterator it_04;
  counting_iterator cVar1;
  size_t in_RSI;
  long *in_RDI;
  bool bVar2;
  int num_digits_1;
  int num_zeros_3;
  int num_zeros_2;
  int num_digits;
  int num_zeros_1;
  int num_zeros;
  int full_exp;
  counting_iterator *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  long *plVar3;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  char *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  counting_iterator in_stack_fffffffffffffe28;
  char local_1c9;
  int in_stack_fffffffffffffe74;
  counting_iterator in_stack_fffffffffffffe78;
  value_type local_17d;
  int local_17c;
  int local_178;
  counting_iterator local_170;
  value_type local_163;
  char local_162 [2];
  size_t local_160;
  int local_14c;
  size_t local_148;
  size_t local_140;
  counting_iterator local_130;
  value_type local_121;
  size_t local_120;
  counting_iterator local_110;
  value_type local_105;
  int local_104;
  size_t local_f8;
  undefined1 local_e9;
  size_t local_e8;
  counting_iterator local_d0;
  value_type local_c2;
  char local_c1;
  int local_c0;
  counting_iterator local_b8;
  value_type local_aa;
  undefined1 local_a9;
  size_t local_a8;
  size_t local_a0;
  size_t local_90;
  size_t local_88;
  counting_iterator local_78;
  value_type local_6b;
  char local_6a [2];
  size_t local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  counting_iterator local_40;
  value_type local_31;
  int local_30;
  counting_iterator local_28;
  value_type local_1e;
  char local_1d;
  int local_1c;
  size_t local_10;
  size_t local_8;
  
  local_1c = (int)in_RDI[1] + *(int *)((long)in_RDI + 0xc);
  local_10 = in_RSI;
  if ((char)*(undefined4 *)((long)in_RDI + 0x1c) == '\x01') {
    local_1d = *(char *)*in_RDI;
    local_28 = counting_iterator::operator++(in_stack_fffffffffffffdf8,0);
    counting_iterator::operator*(&local_28);
    counting_iterator::value_type::operator=(&local_1e,&local_1d);
    local_30 = (int)in_RDI[3] - (int)in_RDI[1];
    if ((1 < (int)in_RDI[1]) || ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0)) {
      local_40 = counting_iterator::operator++(in_stack_fffffffffffffdf8,0);
      counting_iterator::operator*(&local_40);
      counting_iterator::value_type::operator=(&local_31,(char *)(in_RDI + 4));
    }
    local_58 = local_10;
    it_00.count_._7_1_ = in_stack_fffffffffffffe0f;
    it_00.count_._0_7_ = in_stack_fffffffffffffe08;
    local_50 = (size_t)copy_str<char,_const_char_*,_fmt::v6::internal::counting_iterator,_0>
                                 (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,it_00)
    ;
    local_10 = local_50;
    if ((0 < local_30) && ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0)) {
      local_6a[1] = 0x30;
      local_68 = local_50;
      local_60 = (size_t)std::fill_n<fmt::v6::internal::counting_iterator,int,char>
                                   (in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                                    in_stack_fffffffffffffe18);
      local_10 = local_60;
    }
    local_1c9 = 'E';
    if ((*(uint *)((long)in_RDI + 0x1c) & 0x10000) == 0) {
      local_1c9 = 'e';
    }
    local_6a[0] = local_1c9;
    local_78 = counting_iterator::operator++(in_stack_fffffffffffffdf8,0);
    counting_iterator::operator*(&local_78);
    counting_iterator::value_type::operator=(&local_6b,local_6a);
    local_88 = local_10;
    local_8 = (size_t)write_exponent<char,fmt::v6::internal::counting_iterator>
                                (in_stack_fffffffffffffe74,in_stack_fffffffffffffe78);
  }
  else {
    if (local_1c < (int)in_RDI[1]) {
      if (local_1c < 1) {
        local_162[0] = '0';
        local_170 = counting_iterator::operator++(in_stack_fffffffffffffdf8,0);
        counting_iterator::operator*(&local_170);
        counting_iterator::value_type::operator=(&local_163,local_162);
        local_178 = -local_1c;
        local_17c = (int)in_RDI[1];
        if (((local_17c == 0) && (-1 < (int)in_RDI[3])) && ((int)in_RDI[3] < local_178)) {
          local_178 = (int)in_RDI[3];
        }
        if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) == 0) {
          while( true ) {
            bVar2 = false;
            if (0 < local_17c) {
              bVar2 = *(char *)(*in_RDI + (long)(local_17c + -1)) == '0';
            }
            if (!bVar2) break;
            local_17c = local_17c + -1;
          }
          in_stack_fffffffffffffe0f = 0;
        }
        if (((local_178 != 0) || (local_17c != 0)) ||
           ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0)) {
          plVar3 = in_RDI + 4;
          counting_iterator::operator++(in_stack_fffffffffffffdf8,0);
          counting_iterator::operator*((counting_iterator *)&stack0xfffffffffffffe78);
          counting_iterator::value_type::operator=(&local_17d,(char *)plVar3);
          local_10 = (size_t)std::fill_n<fmt::v6::internal::counting_iterator,int,char>
                                       (in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                                        in_stack_fffffffffffffe18);
          cVar1.count_._7_1_ = in_stack_fffffffffffffe0f;
          cVar1.count_._0_7_ = in_stack_fffffffffffffe08;
          local_10 = (size_t)copy_str<char,_const_char_*,_fmt::v6::internal::counting_iterator,_0>
                                       ((char *)plVar3,(char *)in_stack_fffffffffffffdf8,cVar1);
        }
      }
      else {
        it_02.count_._7_1_ = in_stack_fffffffffffffe0f;
        it_02.count_._0_7_ = in_stack_fffffffffffffe08;
        local_f8 = (size_t)copy_str<char,_const_char_*,_fmt::v6::internal::counting_iterator,_0>
                                     (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                                      it_02);
        local_10 = local_f8;
        if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) == 0) {
          local_104 = (int)in_RDI[1];
          while( true ) {
            bVar2 = false;
            if (local_1c < local_104) {
              bVar2 = *(char *)(*in_RDI + (long)(local_104 + -1)) == '0';
            }
            if (!bVar2) break;
            local_104 = local_104 + -1;
          }
          if (local_104 != local_1c) {
            plVar3 = in_RDI + 4;
            local_110 = counting_iterator::operator++(in_stack_fffffffffffffdf8,0);
            counting_iterator::operator*(&local_110);
            counting_iterator::value_type::operator=(&local_105,(char *)plVar3);
          }
          local_120 = local_10;
          it_03.count_._7_1_ = in_stack_fffffffffffffe0f;
          it_03.count_._0_7_ = in_stack_fffffffffffffe08;
          cVar1 = copy_str<char,_const_char_*,_fmt::v6::internal::counting_iterator,_0>
                            (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,it_03);
          return (counting_iterator)cVar1.count_;
        }
        local_130 = counting_iterator::operator++(in_stack_fffffffffffffdf8,0);
        counting_iterator::operator*(&local_130);
        counting_iterator::value_type::operator=(&local_121,(char *)(in_RDI + 4));
        local_148 = local_10;
        it_04.count_._7_1_ = in_stack_fffffffffffffe0f;
        it_04.count_._0_7_ = in_stack_fffffffffffffe08;
        local_160 = (size_t)copy_str<char,_const_char_*,_fmt::v6::internal::counting_iterator,_0>
                                      (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                                       it_04);
        local_10 = local_160;
        if ((int)in_RDI[1] < (int)in_RDI[3]) {
          local_14c = (int)in_RDI[3] - (int)in_RDI[1];
          local_162[1] = 0x30;
          local_140 = local_160;
          local_10 = (size_t)std::fill_n<fmt::v6::internal::counting_iterator,int,char>
                                       (in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                                        in_stack_fffffffffffffe18);
        }
      }
    }
    else {
      it_01.count_._7_1_ = in_stack_fffffffffffffe0f;
      it_01.count_._0_7_ = in_stack_fffffffffffffe08;
      local_a8 = (size_t)copy_str<char,_const_char_*,_fmt::v6::internal::counting_iterator,_0>
                                   (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                                    it_01);
      local_a9 = 0x30;
      local_90 = local_a8;
      local_10 = local_a8;
      local_a0 = (size_t)std::fill_n<fmt::v6::internal::counting_iterator,int,char>
                                   (in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                                    in_stack_fffffffffffffe18);
      local_10 = local_a0;
      if (((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0) || ((int)in_RDI[3] < 0)) {
        cVar1.count_ = (size_t)(in_RDI + 4);
        local_b8 = counting_iterator::operator++(in_stack_fffffffffffffdf8,0);
        counting_iterator::operator*(&local_b8);
        counting_iterator::value_type::operator=(&local_aa,(char *)cVar1.count_);
        local_c0 = (int)in_RDI[3] - local_1c;
        if (local_c0 < 1) {
          if ((char)*(undefined4 *)((long)in_RDI + 0x1c) != '\x02') {
            local_c1 = '0';
            local_d0 = counting_iterator::operator++(in_stack_fffffffffffffdf8,0);
            counting_iterator::operator*(&local_d0);
            counting_iterator::value_type::operator=(&local_c2,&local_c1);
          }
          return (counting_iterator)local_10;
        }
        local_e8 = local_10;
        local_e9 = 0x30;
        local_10 = (size_t)std::fill_n<fmt::v6::internal::counting_iterator,int,char>
                                     (cVar1,in_stack_fffffffffffffe24,in_stack_fffffffffffffe18);
      }
    }
    local_8 = local_10;
  }
  return (counting_iterator)local_8;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }